

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R3_binary_search_tree.c
# Opt level: O1

NODE * deletemin(NODE **p)

{
  NODE *pNVar1;
  node **in_RDI;
  node **ppnVar2;
  
  do {
    ppnVar2 = in_RDI;
    pNVar1 = *ppnVar2;
    in_RDI = &pNVar1->left;
  } while (pNVar1->left != (node *)0x0);
  *ppnVar2 = pNVar1->right;
  return pNVar1;
}

Assistant:

NODE *deletemin(NODE **p) {
  NODE *x;
  while ((*p)->left != NULL) {
    p = &(*p)->left;
  }

  x = *p;
  *p = (*p)->right;
  return x;
}